

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O1

void __thiscall
afsm::test::TranFSM_RealEventSequence_Test::~TranFSM_RealEventSequence_Test
          (TranFSM_RealEventSequence_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TranFSM, RealEventSequence)
{
    using actions::event_process_result;
    using ::psst::ansi_color;
    connection_fsm fsm;
    fsm.make_observer("connection_fsm_def");

    // Enqueueing commands
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::connect{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::complete{}));
    // Connect response
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    // Enqueueing commands
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::begin{}));
    EXPECT_EQ(event_process_result::defer, fsm.process_event(events::execute{}));
    EXPECT_EQ(event_process_result::defer, fsm.process_event(events::commit{}));

    // Server responses
    // Begin
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // Simple query responses
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::row_description{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // Commit response
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
}